

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPCnInp.cpp
# Opt level: O1

void __thiscall NaPetriCnInput::commit_data(NaPetriCnInput *this)

{
  NaPCnPtrAr *pNVar1;
  int *piVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar3 = (*(this->super_NaPetriConnector)._vptr_NaPetriConnector[2])();
  if (0 < iVar3) {
    (*(this->super_NaPetriConnector)._vptr_NaPetriConnector[2])(this);
    pNVar1 = &(this->super_NaPetriConnector).pcaLinked;
    iVar3 = (*(this->super_NaPetriConnector).pcaLinked._vptr_NaDynAr[0xf])(pNVar1,0);
    this->idData = *(int *)(*(long *)CONCAT44(extraout_var,iVar3) + 0x40);
    (*(this->super_NaPetriConnector)._vptr_NaPetriConnector[2])(this);
    iVar3 = (*(this->super_NaPetriConnector).pcaLinked._vptr_NaDynAr[0xf])(pNVar1,0);
    piVar2 = (int *)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x44);
    *piVar2 = *piVar2 + 1;
    NaPetriConnector::commit_data(&this->super_NaPetriConnector);
    return;
  }
  return;
}

Assistant:

void
NaPetriCnInput::commit_data ()
{
    if(links() > 0){
        idData = adjoint()->idData;     // Mark own data as old
        ++adjoint()->nPrCnt;            // One more processed connector

	NaPetriConnector::commit_data();
    }
}